

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O1

void __thiscall
UnitTests::Assert::
RangeError<std::_Deque_iterator<long,long&,long*>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,string *reason,
          _Deque_iterator<long,_long_&,_long_*> *expected_first,
          _Deque_iterator<long,_long_&,_long_*> *expected_last,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last,
          _Deque_iterator<long,_long_&,_long_*> *indicate,ptrdiff_t expected_len,ptrdiff_t got_len)

{
  ostream *poVar1;
  ostringstream s;
  string local_228;
  _Deque_iterator<long,_long_&,_long_*> local_208;
  _Deque_iterator<long,_long_&,_long_*> local_1e8;
  _Deque_iterator<long,_long_&,_long_*> local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (msg->_M_string_length != 0) {
    local_228._M_dataplus._M_p = (pointer)msg;
    poVar1 = details::operator<<((ostream *)local_1a8,
                                 (expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_228);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Expected range [",0x10);
  poVar1 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] different",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(reason->_M_dataplus)._M_p,reason->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," to actual range [",0x12);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  local_1c8._M_cur = expected_first->_M_cur;
  local_1c8._M_first = expected_first->_M_first;
  local_1c8._M_last = expected_first->_M_last;
  local_1c8._M_node = expected_first->_M_node;
  local_1e8._M_cur = expected_last->_M_cur;
  local_1e8._M_first = expected_last->_M_first;
  local_1e8._M_last = expected_last->_M_last;
  local_1e8._M_node = expected_last->_M_node;
  local_208._M_cur = indicate->_M_cur;
  local_208._M_first = indicate->_M_first;
  local_208._M_last = indicate->_M_last;
  local_208._M_node = indicate->_M_node;
  OutputRange<std::_Deque_iterator<long,long&,long*>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((ostream *)local_1a8,&local_1c8,&local_1e8,got_first,got_last,&local_208);
  std::__cxx11::stringbuf::str();
  Error(this,&local_228);
}

Assistant:

[[noreturn]] void RangeError(const std::string& msg, const std::string& reason, ExpectedIt expected_first,
            ExpectedIt expected_last, GotIterator got_first, GotIterator got_last, ExpectedIt indicate,
            ptrdiff_t expected_len, ptrdiff_t got_len) const {
            auto s = std::ostringstream{};
            if (!msg.empty())
            {
                s << stream(msg) << " ";
            }
            s << "Expected range [" << expected_len << "] different" << reason << " to actual range [" << got_len
              << "]\n";
            OutputRange(s, expected_first, expected_last, got_first, got_last, indicate);
            Error(s.str());
        }